

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_tandem.cc
# Opt level: O0

bool __thiscall
sptk::AperiodicityExtractionByTandem::Run
          (AperiodicityExtractionByTandem *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  double dVar5;
  double *unaff_retaddr;
  int in_stack_00000010;
  double **in_stack_00000018;
  vector<double,_std::allocator<double>_> *vector;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  vector<double_*,_std::allocator<double_*>_> pointers;
  int i_2;
  int length;
  int i_1;
  vector<double,_std::allocator<double>_> time_axis;
  double frame_shift_in_sec;
  int i;
  double nyquist_frequency;
  int f0_length;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<double_*,_std::allocator<double_*>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar6;
  size_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_a0;
  int local_80;
  int local_7c;
  int local_78;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  int local_3c;
  double local_38;
  int local_2c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_28;
  int f0_length_00;
  double *f0_00;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  byte bVar7;
  
  if (((ulong)in_RDI[3] & 1) != 0) {
    local_28 = in_RCX;
    f0_00 = in_RDI;
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (!bVar1) {
      bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if ((!bVar1) &&
         (local_28 !=
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x0)) {
        sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
        local_2c = (int)sVar2;
        local_38 = in_RDI[2] * 0.5;
        for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_3c);
          dVar5 = local_38;
          if (*pvVar3 <= 0.0 && *pvVar3 != 0.0) {
LAB_00109c54:
            bVar7 = 0;
            goto LAB_0010a022;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_3c);
          if (dVar5 < *pvVar3) goto LAB_00109c54;
        }
        local_48 = (double)*(int *)((long)in_RDI + 0xc) / in_RDI[2];
        std::allocator<double>::allocator((allocator<double> *)0x109cb4);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        std::allocator<double>::~allocator((allocator<double> *)0x109cda);
        for (local_78 = 0; local_78 < local_2c; local_78 = local_78 + 1) {
          dVar5 = (double)local_78 * local_48;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_60,(long)local_78);
          *pvVar4 = dVar5;
        }
        sVar2 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(local_28);
        if (sVar2 != (long)local_2c) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        }
        local_7c = *(int *)(in_RDI + 1) / 2 + 1;
        for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
          this_00 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](local_28,(long)local_80);
          sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
          if (sVar2 != (long)local_7c) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](local_28,(long)local_80);
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
          }
        }
        std::vector<double_*,_std::allocator<double_*>_>::vector
                  ((vector<double_*,_std::allocator<double_*>_> *)0x109e60);
        std::vector<double_*,_std::allocator<double_*>_>::reserve
                  ((vector<double_*,_std::allocator<double_*>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
        local_a0 = local_28;
        local_a8._M_current =
             (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)in_stack_fffffffffffffed0,
                             (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator*(&local_a8);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x109eeb);
          std::vector<double_*,_std::allocator<double_*>_>::push_back
                    (in_stack_fffffffffffffed0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          __gnu_cxx::
          __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator++(&local_a8);
        }
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x109f48);
        std::vector<double,_std::allocator<double>_>::size(in_RSI);
        f0_length_00 = (int)((ulong)in_RSI >> 0x20);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x109f7c);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x109f99);
        uVar6 = *(undefined4 *)(in_RDI + 1);
        std::vector<double_*,_std::allocator<double_*>_>::data
                  ((vector<double_*,_std::allocator<double_*>_> *)0x109fba);
        world::AperiodicityRatio
                  (unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,f0_00,
                   f0_length_00,(double *)in_RDX,in_stack_00000010,in_stack_00000018);
        bVar7 = 1;
        std::vector<double_*,_std::allocator<double_*>_>::~vector
                  ((vector<double_*,_std::allocator<double_*>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffee0));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffee0));
        goto LAB_0010a022;
      }
    }
  }
  bVar7 = 0;
LAB_0010a022:
  return (bool)(bVar7 & 1);
}

Assistant:

bool AperiodicityExtractionByTandem::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty() || f0.empty() || NULL == aperiodicity) {
    return false;
  }

  // Check F0 values to prevent segmentation fault.
  const int f0_length(static_cast<int>(f0.size()));
  const double nyquist_frequency(0.5 * sampling_rate_);
  for (int i(0); i < f0_length; ++i) {
    if (f0[i] < 0.0 || nyquist_frequency < f0[i]) {
      return false;
    }
  }

  const double frame_shift_in_sec(frame_shift_ / sampling_rate_);
  std::vector<double> time_axis(f0_length);
  for (int i(0); i < f0_length; ++i) {
    time_axis[i] = i * frame_shift_in_sec;
  }

  // Prepare memories.
  if (aperiodicity->size() != static_cast<std::size_t>(f0_length)) {
    aperiodicity->resize(f0_length);
  }
  const int length(fft_length_ / 2 + 1);
  for (int i(0); i < f0_length; ++i) {
    if ((*aperiodicity)[i].size() != static_cast<std::size_t>(length)) {
      (*aperiodicity)[i].resize(length);
    }
  }

  std::vector<double*> pointers;
  pointers.reserve(f0_length);
  for (std::vector<double>& vector : *aperiodicity) {
    pointers.push_back(vector.data());
  }

  world::AperiodicityRatio(
      const_cast<double*>(waveform.data()), static_cast<int>(waveform.size()),
      static_cast<int>(sampling_rate_), const_cast<double*>(f0.data()),
      f0_length, const_cast<double*>(time_axis.data()), fft_length_,
      pointers.data());

  return true;
}